

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O1

void __thiscall senjo::UCIAdapter::UCICommand(UCIAdapter *this,char *params)

{
  _List_node_base *p_Var1;
  size_t sVar2;
  UCIAdapter *pUVar3;
  int iVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  _List_node_base *p_Var7;
  string author;
  string email;
  string country;
  Output out;
  list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> opts;
  Output local_100;
  long local_f8;
  _func_int *local_f0 [2];
  Output local_e0;
  long local_d8;
  _func_int *local_d0 [2];
  Output local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  Output local_a0;
  long local_98;
  _func_int *local_90 [2];
  UCIAdapter *local_80;
  long local_78;
  Output local_70;
  _List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> local_68;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  sVar2 = DAT_001b17b8;
  if (((params == (char *)0x0 || DAT_001b17b8 == 0) ||
      (iVar4 = strncmp(params,token::Help_abi_cxx11_,DAT_001b17b8), iVar4 != 0)) ||
     ((params[sVar2] != '\0' && (iVar4 = isspace((int)params[sVar2]), iVar4 == 0)))) {
    (*this->engine->_vptr_ChessEngine[5])(&local_68);
    Output::Output(&local_a0,NoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"id name ",8);
    (**this->engine->_vptr_ChessEngine)(&local_e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_e0._vptr_Output,local_d8);
    local_c0._vptr_Output._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_c0,1);
    (*this->engine->_vptr_ChessEngine[1])(&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               (char *)CONCAT71(local_c0._vptr_Output._1_7_,local_c0._vptr_Output._0_1_),local_b8);
    if ((undefined1 *)CONCAT71(local_c0._vptr_Output._1_7_,local_c0._vptr_Output._0_1_) != local_b0)
    {
      operator_delete((undefined1 *)
                      CONCAT71(local_c0._vptr_Output._1_7_,local_c0._vptr_Output._0_1_));
    }
    if (local_e0._vptr_Output != local_d0) {
      operator_delete(local_e0._vptr_Output);
    }
    Output::~Output(&local_a0);
    (*this->engine->_vptr_ChessEngine[2])(&local_e0);
    if (local_d8 != 0) {
      Output::Output(&local_c0,NoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"id author ",10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_e0._vptr_Output,local_d8);
      Output::~Output(&local_c0);
    }
    (*this->engine->_vptr_ChessEngine[3])(&local_c0);
    if (local_b8 != 0) {
      Output::Output(&local_a0,NoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"id email ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 (char *)CONCAT71(local_c0._vptr_Output._1_7_,local_c0._vptr_Output._0_1_),local_b8)
      ;
      Output::~Output(&local_a0);
    }
    (*this->engine->_vptr_ChessEngine[4])(&local_a0);
    if (local_98 != 0) {
      Output::Output(&local_100,NoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"id country ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_a0._vptr_Output,local_98);
      Output::~Output(&local_100);
    }
    local_80 = this;
    if (local_68._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_68) {
      local_78 = -0x8000000000000000;
      p_Var7 = local_68._M_impl._M_node.super__List_node_base._M_next;
      do {
        Output::Output(&local_70,NoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"option name ",0xc)
        ;
        p_Var1 = p_Var7 + 1;
        (*(code *)(p_Var7[1]._M_next)->_M_prev)(&local_100,p_Var1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)local_100._vptr_Output,local_f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," type ",6);
        (*(code *)p_Var1->_M_next->_M_next)(&local_50,p_Var1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_50,local_48);
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        if (local_100._vptr_Output != local_f0) {
          operator_delete(local_100._vptr_Output);
        }
        (*(code *)p_Var1->_M_next[2]._M_next)(&local_100);
        lVar5 = local_f8;
        if (local_100._vptr_Output != local_f0) {
          operator_delete(local_100._vptr_Output);
        }
        if (lVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," default ",9);
          (*(code *)p_Var1->_M_next[2]._M_next)(&local_100,p_Var1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_100._vptr_Output,local_f8);
          if (local_100._vptr_Output != local_f0) {
            operator_delete(local_100._vptr_Output);
          }
        }
        lVar5 = (*(code *)p_Var1->_M_next[3]._M_next)(p_Var1);
        if (lVar5 != local_78) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," min ",5);
          (*(code *)p_Var1->_M_next[3]._M_next)(p_Var1);
          std::ostream::_M_insert<long>((long)&std::cout);
        }
        lVar5 = (*(code *)p_Var1->_M_next[3]._M_prev)(p_Var1);
        if (lVar5 != 0x7fffffffffffffff) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," max ",5);
          (*(code *)p_Var1->_M_next[3]._M_prev)(p_Var1);
          std::ostream::_M_insert<long>((long)&std::cout);
        }
        lVar5 = (*(code *)p_Var1->_M_next[4]._M_next)(p_Var1);
        for (p_Var6 = *(_Rb_tree_node_base **)(lVar5 + 0x18);
            p_Var6 != (_Rb_tree_node_base *)(lVar5 + 8);
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," var ",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
        }
        Output::~Output(&local_70);
        p_Var7 = (((_List_impl *)&p_Var7->_M_next)->_M_node).super__List_node_base._M_next;
      } while (p_Var7 != (_List_node_base *)&local_68);
    }
    Output::Output(&local_100,NoPrefix);
    pUVar3 = local_80;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"uciok",5);
    Output::~Output(&local_100);
    iVar4 = (*pUVar3->engine->_vptr_ChessEngine[0x17])();
    if ((char)iVar4 != '\0') {
      Output::Output(&local_100,NoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"copyprotection checking",0x17);
      Output::~Output(&local_100);
      iVar4 = (*pUVar3->engine->_vptr_ChessEngine[0x18])();
      if ((char)iVar4 == '\0') {
        Output::Output(&local_100,NoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"copyprotection error",0x14);
      }
      else {
        Output::Output(&local_100,NoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"copyprotection ok",0x11);
      }
      Output::~Output(&local_100);
    }
    iVar4 = (*pUVar3->engine->_vptr_ChessEngine[0x14])();
    if ((char)iVar4 == '\0') {
      Output::Output(&local_100,NoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"registration error",0x12);
      Output::~Output(&local_100);
    }
    if (local_a0._vptr_Output != local_90) {
      operator_delete(local_a0._vptr_Output);
    }
    if ((undefined1 *)CONCAT71(local_c0._vptr_Output._1_7_,local_c0._vptr_Output._0_1_) != local_b0)
    {
      operator_delete((undefined1 *)
                      CONCAT71(local_c0._vptr_Output._1_7_,local_c0._vptr_Output._0_1_));
    }
    if (local_e0._vptr_Output != local_d0) {
      operator_delete(local_e0._vptr_Output);
    }
    std::__cxx11::_List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>::_M_clear
              (&local_68);
  }
  else {
    Output::Output(&local_e0,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,token::Uci_abi_cxx11_,DAT_001b19d8);
    Output::~Output(&local_e0);
    Output::Output(&local_e0,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Output engine info and options followed by uciok.",0x31);
    Output::~Output(&local_e0);
  }
  return;
}

Assistant:

void UCIAdapter::UCICommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Uci;
    Output() << "Output engine info and options followed by uciok.";
    return;
  }

  std::list<EngineOption> opts = engine->GetOptions();
  Output(Output::NoPrefix) << "id name " << engine->GetEngineName()
                           << ' ' << engine->GetEngineVersion();

  const std::string author = engine->GetAuthorName();
  if (author.size()) {
    Output(Output::NoPrefix) << "id author " << author;
  }

  const std::string email = engine->GetEmailAddress();
  if (email.size()) {
    Output(Output::NoPrefix) << "id email " << email;
  }

  const std::string country = engine->GetCountryName();
  if (country.size()) {
    Output(Output::NoPrefix) << "id country " << country;
  }

  std::list<EngineOption>::const_iterator opt;
  for (opt = opts.begin(); opt != opts.end(); ++opt) {
    Output out(Output::NoPrefix);
    out << "option name " << opt->GetName() << " type " << opt->GetTypeName();
    if (opt->GetDefaultValue().size()) {
      out << " default " << opt->GetDefaultValue();
    }
    if (opt->GetMinValue() > INT64_MIN) {
      out << " min " << opt->GetMinValue();
    }
    if (opt->GetMaxValue() < INT64_MAX) {
      out << " max " << opt->GetMaxValue();
    }
    const std::set<std::string>& comboValues = opt->GetComboValues();
    std::set<std::string>::const_iterator val;
    for (val = comboValues.begin(); val != comboValues.end(); ++val) {
      out << " var " << *val;
    }
  }

  Output(Output::NoPrefix) << "uciok";

  if (engine->IsCopyProtected()) {
    Output(Output::NoPrefix) << "copyprotection checking";
    if (engine->CopyIsOK()) {
      Output(Output::NoPrefix) << "copyprotection ok";
    }
    else {
      Output(Output::NoPrefix) << "copyprotection error";
    }
  }

  if (!engine->IsRegistered()) {
    Output(Output::NoPrefix) << "registration error";
  }
}